

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fcss(double *b,int pq,void *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *__dest;
  void *__dest_00;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  uVar1 = *params;
  lVar11 = (long)(int)uVar1;
  uVar2 = *(uint *)((long)params + 8);
  uVar3 = *(uint *)((long)params + 0x18);
  __dest = malloc(lVar11 * 8);
  __dest_00 = malloc((long)(int)uVar2 * 8);
  uVar12 = (ulong)uVar1;
  if (0 < lVar11) {
    memcpy(__dest,b,uVar12 * 8);
  }
  if (0 < (int)uVar2) {
    memcpy(__dest_00,b + lVar11,(long)(int)uVar2 * 8);
  }
  if (0 < (int)uVar1) {
    memset((void *)((long)params + (long)(int)uVar3 * 8 + 0x680),0,uVar12 * 8);
  }
  if (0 < (int)uVar3 && *(int *)((long)params + 0x1c) == 1) {
    uVar6 = 0;
    do {
      *(double *)((long)params + uVar6 * 8 + 0x680) =
           *(double *)((long)params + uVar6 * 8 + (ulong)uVar3 * 0x10 + 0x680) -
           b[(int)(uVar1 + uVar2)];
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  dVar14 = 0.0;
  dVar13 = 0.0;
  if ((int)uVar1 < (int)uVar3) {
    lVar7 = (lVar11 << 0x20) + -0x100000000;
    lVar9 = ((ulong)(uVar3 + uVar1) << 0x20) + -0x100000000;
    uVar10 = 0;
    do {
      uVar4 = uVar10;
      if ((int)uVar2 < (int)uVar10) {
        uVar4 = uVar2;
      }
      dVar14 = *(double *)((long)params + lVar11 * 8 + 0x680);
      if (0 < (int)uVar1) {
        uVar6 = 0;
        lVar8 = lVar7;
        do {
          dVar14 = dVar14 - *(double *)((long)__dest + uVar6 * 8) *
                            *(double *)((long)params + (lVar8 >> 0x1d) + 0x680);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + -0x100000000;
        } while (uVar12 != uVar6);
      }
      uVar5 = (int)lVar11 - uVar1;
      if ((int)uVar2 <= (int)uVar5) {
        uVar5 = uVar2;
      }
      if (0 < (int)uVar5) {
        uVar6 = 0;
        lVar8 = lVar9;
        do {
          dVar14 = dVar14 - *(double *)((long)__dest_00 + uVar6 * 8) *
                            *(double *)((long)params + (lVar8 >> 0x1d) + 0x680);
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + -0x100000000;
        } while (uVar4 != uVar6);
      }
      uVar10 = uVar10 + 1;
      *(double *)((long)params + ((int)uVar3 + lVar11) * 8 + 0x680) = dVar14;
      dVar13 = dVar13 + dVar14 * dVar14;
      lVar11 = lVar11 + 1;
      lVar7 = lVar7 + 0x100000000;
      lVar9 = lVar9 + 0x100000000;
    } while (uVar10 != uVar3 - uVar1);
    dVar14 = (double)(int)(uVar3 - uVar1);
  }
  *(double *)((long)params + 0x30) = dVar13;
  dVar13 = log(dVar13 / dVar14);
  *(double *)((long)params + 0x38) = dVar13 * 0.5;
  free(__dest);
  free(__dest_00);
  return dVar13 * 0.5;
}

Assistant:

double fcss(double *b, int pq, void *params) {
	double value,ssq,temp;
	int ip, iq, N,i,ncond,j,jm,iter;
	double *phi, *theta;
	alik_css_object obj = (alik_css_object)params;

	ip = obj->p;
	iq = obj->q;

	N = obj->N;

	value = ssq = 0.0;
	ncond = ip;
	iter = 0;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	for (i = 0; i < ncond; ++i) {
		obj->x[N + i] = 0.0;
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip+iq];
		}
	}

	for (i = ncond; i < N; ++i) {
		iter++;
		temp = obj->x[i];

		for (j = 0; j < ip; ++j) {
			temp = temp -  phi[j] * obj->x[i - j - 1];
		}

		if (i - ncond < iq) {
			jm = i - ncond;
		}
		else {
			jm = iq;
		}

		for (j = 0; j < jm; ++j) {
			temp = temp - theta[j] * obj->x[N + i - j - 1];
		}

		obj->x[N + i] = temp;
		ssq += temp * temp;
	}
	obj->ssq = ssq;
	value = 0.5 * log(ssq / (double)iter);
	obj->loglik = value;

	free(phi);
	free(theta);
	return value;
}